

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

void __thiscall FIX::SessionID::fromString(SessionID *this,string *str)

{
  long lVar1;
  long lVar2;
  long lVar3;
  STRING SStack_a8;
  FieldBase local_88;
  
  lVar1 = std::__cxx11::string::find((char)str,0x3a);
  lVar2 = std::__cxx11::string::find((char *)str,0x25bec2);
  lVar3 = std::__cxx11::string::rfind((char)str,0x3a);
  if (lVar2 != -1 && lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&SStack_a8,(ulong)str);
    BeginString::BeginString((BeginString *)&local_88,&SStack_a8);
    FieldBase::operator=((FieldBase *)this,&local_88);
    FieldBase::~FieldBase(&local_88);
    std::__cxx11::string::~string((string *)&SStack_a8);
    std::__cxx11::string::substr((ulong)&SStack_a8,(ulong)str);
    SenderCompID::SenderCompID((SenderCompID *)&local_88,&SStack_a8);
    FieldBase::operator=((FieldBase *)&this->m_senderCompID,&local_88);
    FieldBase::~FieldBase(&local_88);
    std::__cxx11::string::~string((string *)&SStack_a8);
    if (lVar1 == lVar3) {
      std::__cxx11::string::substr((ulong)&SStack_a8,(ulong)str);
      TargetCompID::TargetCompID((TargetCompID *)&local_88,&SStack_a8);
      FieldBase::operator=((FieldBase *)&this->m_targetCompID,&local_88);
      FieldBase::~FieldBase(&local_88);
      std::__cxx11::string::~string((string *)&SStack_a8);
      std::__cxx11::string::assign((char *)&this->m_sessionQualifier);
    }
    else {
      std::__cxx11::string::substr((ulong)&SStack_a8,(ulong)str);
      TargetCompID::TargetCompID((TargetCompID *)&local_88,&SStack_a8);
      FieldBase::operator=((FieldBase *)&this->m_targetCompID,&local_88);
      FieldBase::~FieldBase(&local_88);
      std::__cxx11::string::~string((string *)&SStack_a8);
      std::__cxx11::string::substr((ulong)&local_88,(ulong)str);
      std::__cxx11::string::operator=((string *)&this->m_sessionQualifier,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    toString(this,&this->m_frozenString);
  }
  return;
}

Assistant:

void fromString(const std::string &str) {
    std::string::size_type first = str.find_first_of(':');
    std::string::size_type second = str.find("->");
    std::string::size_type third = str.find_last_of(':');
    if (first == std::string::npos) {
      return;
    }
    if (second == std::string::npos) {
      return;
    }
    m_beginString = str.substr(0, first);
    m_senderCompID = str.substr(first + 1, second - first - 1);
    if (first == third) {
      m_targetCompID = str.substr(second + 2);
      m_sessionQualifier = "";
    } else {
      m_targetCompID = str.substr(second + 2, third - second - 2);
      m_sessionQualifier = str.substr(third + 1);
    }
    toString(m_frozenString);
  }